

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian.cpp
# Opt level: O1

void interpolate_extremum
               (int row,int col,response_layer *top,response_layer *middle,response_layer *bottom,
               vector<interest_point,_std::allocator<interest_point>_> *interest_points)

{
  pointer *ppiVar1;
  int iVar2;
  int iVar3;
  iterator __position;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 in_register_00001304 [12];
  float offsets [3];
  ulong local_158;
  uint local_150;
  undefined1 local_148 [64];
  undefined1 local_108 [64];
  undefined1 local_c8 [64];
  undefined1 auStack_88 [20];
  undefined1 local_74 [44];
  undefined1 auStack_48 [20];
  
  iVar2 = middle->filter_size;
  iVar3 = bottom->filter_size;
  interpolate_step(row,col,top,middle,bottom,(float *)&local_158);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_158;
  auVar9._8_4_ = 0x7fffffff;
  auVar9._0_8_ = 0x7fffffff7fffffff;
  auVar9._12_4_ = 0x7fffffff;
  auVar6 = vandps_avx(auVar6,auVar9);
  auVar5._8_4_ = 0x3f000000;
  auVar5._0_8_ = 0x3f0000003f000000;
  auVar5._12_4_ = 0x3f000000;
  uVar4 = vcmpps_avx512vl(auVar6,auVar5,1);
  if (((uVar4 & 1) != 0) && ((uVar4 >> 1 & 1) != 0)) {
    auVar6 = vandps_avx(ZEXT416(local_150),auVar9);
    if (auVar6._0_4_ < 0.5) {
      local_108 = ZEXT864(0) << 0x20;
      auStack_48 = (undefined1  [20])0x0;
      auStack_88 = local_108._0_20_;
      local_74 = (undefined1  [44])0x0;
      auVar6 = vpinsrd_avx(ZEXT416((uint)col),row,1);
      auVar6 = vcvtdq2ps_avx(auVar6);
      fVar11 = (float)top->step;
      auVar7._0_4_ = ((float)local_158 + auVar6._0_4_) * fVar11;
      auVar7._4_4_ = ((float)(local_158 >> 0x20) + auVar6._4_4_) * fVar11;
      auVar7._8_4_ = (auVar6._8_4_ + 0.0) * fVar11;
      auVar7._12_4_ = (auVar6._12_4_ + 0.0) * fVar11;
      local_148._0_8_ = vmovlps_avx(auVar7);
      auVar8._0_4_ = (float)middle->filter_size;
      auVar8._4_12_ = in_register_00001304;
      auVar10._0_4_ = (float)(iVar2 - iVar3);
      auVar10._4_12_ = in_register_00001304;
      auVar6 = vfmadd213ss_fma(auVar10,ZEXT416(local_150),auVar8);
      local_148._8_4_ = auVar6._0_4_ * 0.1333;
      local_148._12_4_ = 0;
      local_148[0x10] = 1;
      local_148._18_46_ = SUB5246((undefined1  [52])0x0,6);
      local_148[0x11] =
           middle->laplacian[(middle->width * row + col) * (middle->width / top->width)];
      __position._M_current =
           (interest_points->super__Vector_base<interest_point,_std::allocator<interest_point>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      local_c8 = local_108;
      if (__position._M_current ==
          (interest_points->super__Vector_base<interest_point,_std::allocator<interest_point>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<interest_point,std::allocator<interest_point>>::
        _M_realloc_insert<interest_point_const&>
                  ((vector<interest_point,std::allocator<interest_point>> *)interest_points,
                   __position,(interest_point *)local_148);
      }
      else {
        memcpy(__position._M_current,local_148,0x114);
        ppiVar1 = &(interest_points->
                   super__Vector_base<interest_point,_std::allocator<interest_point>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppiVar1 = *ppiVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

void interpolate_extremum(int row, int col,
                          struct response_layer *top, struct response_layer *middle, struct response_layer *bottom,
                          std::vector<struct interest_point> *interest_points) {

    assert(top != NULL && middle != NULL && bottom != NULL);
    assert(interest_points != NULL);

    // getting step distance between filters
    int filter_step = (middle->filter_size - bottom->filter_size);

    // checking if middle filter is mid way between top and bottom
    assert(filter_step > 0 && top->filter_size - middle->filter_size == middle->filter_size - bottom->filter_size);

    // getting sub-pixel offset of extremum to actual location
    float offsets[3];
    interpolate_step(row, col, top, middle, bottom, offsets);

    // getting sub-pixel offsets and assigning them to variables for clarity
    float dx = offsets[0];
    float dy = offsets[1];
    float ds = offsets[2];

    // checking if sub-pixel offsets are less than 0.5 and
    // would thus rounded sub-pixel location is the same as pixel location
    if (fabs(dx) < 0.5f && fabs(dy) < 0.5f && fabs(ds) < 0.5f) {

        // initializing interest point
        struct interest_point ip = {
            .x = (float) ((col + dx) * top->step),
            .y = (float) ((row + dy) * top->step),
            .scale = (float) ((0.1333f) * (middle->filter_size + ds * filter_step)),
            .orientation = 0.0f,
            .upright = true,
            .laplacian = get_laplacian_relative(middle, row, col, top),
            .descriptor = {0}
        };

        // Add interest point to vector
        interest_points->push_back(ip);

    }

}